

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::AttachToGraph
               (aiNode *attach,
               vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               *srcList)

{
  aiNode **__src;
  aiNode *paVar1;
  pointer pNVar2;
  aiNode **ppaVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar5 = (ulong)attach->mNumChildren;
  if (attach->mNumChildren != 0) {
    uVar7 = 0;
    do {
      AttachToGraph(attach->mChildren[uVar7],srcList);
      uVar7 = uVar7 + 1;
      uVar5 = (ulong)attach->mNumChildren;
    } while (uVar7 < uVar5);
  }
  iVar6 = 0;
  for (pNVar2 = (srcList->
                super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pNVar2 != (srcList->
                super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                )._M_impl.super__Vector_impl_data._M_finish; pNVar2 = pNVar2 + 1) {
    if (pNVar2->attachToNode == attach) {
      iVar6 = iVar6 + (pNVar2->resolved ^ 1);
    }
  }
  if (iVar6 != 0) {
    ppaVar3 = (aiNode **)operator_new__((ulong)(uint)(iVar6 + (int)uVar5) << 3);
    if ((int)uVar5 != 0) {
      __src = attach->mChildren;
      memcpy(ppaVar3,__src,uVar5 << 3);
      if (__src != (aiNode **)0x0) {
        operator_delete__(__src);
      }
    }
    attach->mChildren = ppaVar3;
    uVar4 = attach->mNumChildren;
    attach->mNumChildren = iVar6 + uVar4;
    pNVar2 = (srcList->
             super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((srcList->
        super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>)
        ._M_impl.super__Vector_impl_data._M_finish != pNVar2) {
      ppaVar3 = ppaVar3 + uVar4;
      uVar4 = 1;
      uVar5 = 0;
      do {
        if ((pNVar2[uVar5].attachToNode == attach) &&
           (pNVar2 = pNVar2 + uVar5, pNVar2->resolved == false)) {
          paVar1 = pNVar2->node;
          *ppaVar3 = paVar1;
          paVar1->mParent = attach;
          ppaVar3 = ppaVar3 + 1;
          pNVar2->resolved = true;
        }
        uVar5 = (ulong)uVar4;
        pNVar2 = (srcList->
                 super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar4 = uVar4 + 1;
      } while (uVar5 < (ulong)((long)(srcList->
                                     super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 5
                              ));
    }
  }
  return;
}

Assistant:

void SceneCombiner::AttachToGraph (aiNode* attach, std::vector<NodeAttachmentInfo>& srcList) {
    unsigned int cnt;
    for ( cnt = 0; cnt < attach->mNumChildren; ++cnt ) {
        AttachToGraph( attach->mChildren[ cnt ], srcList );
    }

    cnt = 0;
    for (std::vector<NodeAttachmentInfo>::iterator it = srcList.begin();
         it != srcList.end(); ++it)
    {
        if ((*it).attachToNode == attach && !(*it).resolved)
            ++cnt;
    }

    if (cnt)    {
        aiNode** n = new aiNode*[cnt+attach->mNumChildren];
        if (attach->mNumChildren)   {
            ::memcpy(n,attach->mChildren,sizeof(void*)*attach->mNumChildren);
            delete[] attach->mChildren;
        }
        attach->mChildren = n;

        n += attach->mNumChildren;
        attach->mNumChildren += cnt;

        for (unsigned int i = 0; i < srcList.size();++i)    {
            NodeAttachmentInfo& att = srcList[i];
            if (att.attachToNode == attach && !att.resolved)    {
                *n = att.node;
                (**n).mParent = attach;
                ++n;

                // mark this attachment as resolved
                att.resolved = true;
            }
        }
    }
}